

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

VARR_token_t * do_concat(c2m_ctx_t c2m_ctx,VARR_token_t *tokens)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  token_t *pptVar4;
  VARR_token_t *pVVar5;
  token_t ptVar6;
  VARR_char *pVVar7;
  undefined8 uVar8;
  VARR_stream_t *pVVar9;
  size_t sVar10;
  MIR_context_t pMVar11;
  int iVar12;
  int iVar13;
  token_t ptVar14;
  token_t ptVar15;
  ulong uVar16;
  void *pvVar17;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  undefined8 *extraout_RDX;
  char **ppcVar21;
  VARR_token_t *pVVar22;
  c2m_ctx_t pcVar23;
  c2m_ctx_t c2m_ctx_00;
  uint uVar24;
  VARR_token_t *unaff_R12;
  long lVar25;
  c2mir_options *pcVar26;
  ulong uVar27;
  bool bVar28;
  str_t sVar29;
  
  pVVar22 = tokens;
  pcVar23 = c2m_ctx;
  if (tokens != (VARR_token_t *)0x0) {
    uVar19 = (uint)tokens->els_num;
    uVar20 = uVar19;
    do {
      do {
        uVar24 = uVar20;
        if ((int)uVar24 < 1) {
          if (0 < (int)uVar19) {
            uVar27 = (ulong)uVar19;
            do {
              uVar16 = uVar27 - 1;
              if ((tokens->varr == (token_t *)0x0) || (tokens->els_num <= uVar16)) {
                do_concat_cold_12();
LAB_00194724:
                do_concat_cold_14();
LAB_00194729:
                do_concat_cold_5();
LAB_0019472e:
                do_concat_cold_3();
LAB_00194733:
                do_concat_cold_2();
LAB_00194738:
                __assert_fail("k >= 0 && j < len",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0xaa9,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
              }
              *(undefined2 *)&tokens->varr[uVar16]->field_0x2 = 1;
              bVar28 = 1 < (long)uVar27;
              uVar27 = uVar16;
            } while (bVar28);
          }
          return tokens;
        }
        pptVar4 = tokens->varr;
        if (pptVar4 == (token_t *)0x0) goto LAB_00194724;
        uVar20 = uVar24 - 1;
        pVVar5 = (VARR_token_t *)tokens->els_num;
        if (pVVar5 <= (VARR_token_t *)(ulong)uVar20) goto LAB_00194724;
        ptVar14 = pptVar4[(long)(ulong)uVar20];
      } while (*(short *)ptVar14 != 0x142);
      if ((uVar24 == 1) || ((int)uVar19 <= (int)uVar24)) goto LAB_00194738;
      if (pVVar5 <= (VARR_token_t *)(ulong)uVar24) {
        do_concat_cold_1();
LAB_00194780:
        do_concat_cold_9();
LAB_00194785:
        do_concat_cold_6();
LAB_0019478a:
        do_concat_cold_7();
LAB_0019478f:
        do_concat_cold_8();
LAB_00194794:
        do_concat_cold_13();
LAB_00194799:
        __assert_fail("cs->f == NULL && cs->f == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x42a,"void remove_string_stream(c2m_ctx_t)");
      }
      if ((*(short *)pptVar4[(long)(ulong)uVar24] == 0x20) ||
         (uVar20 = uVar24, *(short *)pptVar4[(long)(ulong)uVar24] == 10)) {
        uVar20 = uVar24 + 1;
      }
      unaff_R12 = (VARR_token_t *)(ulong)(uVar24 - 2);
      if (pVVar5 <= unaff_R12) goto LAB_00194733;
      if ((*(short *)pptVar4[(long)unaff_R12] == 0x20) || (*(short *)pptVar4[(long)unaff_R12] == 10)
         ) {
        unaff_R12 = (VARR_token_t *)(ulong)(uVar24 - 3);
      }
      iVar13 = (int)unaff_R12;
      if ((iVar13 < 0) || ((int)uVar19 <= (int)uVar20)) {
LAB_0019475c:
        __assert_fail("k >= 0 && j < len",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0xaae,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
      }
      if (pVVar5 <= (VARR_token_t *)(ulong)uVar20) goto LAB_0019472e;
      if (pVVar5 <= unaff_R12) {
        do_concat_cold_4();
        goto LAB_0019475c;
      }
      ptVar15 = pptVar4[(long)(ulong)uVar20];
      uVar1 = *(ushort *)ptVar15;
      pcVar23 = (c2m_ctx_t)(ulong)uVar1;
      ptVar6 = pptVar4[(long)unaff_R12];
      uVar2 = *(ushort *)ptVar6;
      pVVar22 = (VARR_token_t *)(ulong)uVar2;
      if ((uVar1 == 0x141) || (uVar2 == 0x141)) {
        if (uVar1 == 0x141) {
          uVar24 = uVar20 + 1;
          if ((int)uVar19 <= (int)uVar24) goto LAB_00194603;
          if ((VARR_token_t *)(ulong)uVar24 < pVVar5) {
            if ((*(short *)pptVar4[(long)(ulong)uVar24] == 0x20) ||
               (*(short *)pptVar4[(long)(ulong)uVar24] == 10)) {
              uVar20 = uVar24;
            }
            goto LAB_00194603;
          }
LAB_001947bd:
          do_concat_cold_10();
          break;
        }
        uVar20 = uVar20 - 1;
LAB_00194603:
        if (uVar2 == 0x141) {
          if (iVar13 == 0) {
            unaff_R12 = (VARR_token_t *)0x0;
          }
          else {
            uVar19 = iVar13 - 1;
            if (pVVar5 <= (VARR_token_t *)(ulong)uVar19) {
              do_concat_cold_11();
              goto LAB_001947bd;
            }
            if ((*(short *)pptVar4[(long)(ulong)uVar19] == 0x20) ||
               (*(short *)pptVar4[(long)(ulong)uVar19] == 10)) {
              unaff_R12 = (VARR_token_t *)(ulong)uVar19;
            }
          }
        }
        else {
          unaff_R12 = (VARR_token_t *)(ulong)(iVar13 + 1);
        }
        iVar13 = (int)unaff_R12;
        if ((uVar1 == 0x141) && (uVar2 == 0x141)) {
          del_tokens(tokens,iVar13,uVar20 - iVar13);
          pcVar18 = (ptVar14->pos).fname;
          iVar13 = (ptVar14->pos).lno;
          iVar12 = (ptVar14->pos).ln_pos;
          ptVar14 = (token_t)reg_malloc(c2m_ctx,0x30);
          *(undefined4 *)ptVar14 = 0x20;
          (ptVar14->pos).fname = pcVar18;
          (ptVar14->pos).lno = iVar13;
          (ptVar14->pos).ln_pos = iVar12;
          ptVar14->repr = "";
          ptVar14->node_code = N_IGNORE;
          ptVar14->node = (node_t_conflict)0x0;
          if ((tokens->varr == (token_t *)0x0) || ((VARR_token_t *)tokens->els_num <= unaff_R12))
          goto LAB_00194794;
          tokens->varr[(long)unaff_R12] = ptVar14;
        }
        else {
          del_tokens(tokens,iVar13,(uVar20 - iVar13) + 1);
        }
      }
      else {
        pVVar7 = c2m_ctx->temp_string;
        if ((pVVar7 == (VARR_char *)0x0) || (pVVar7->varr == (char *)0x0)) goto LAB_00194780;
        pVVar7->els_num = 0;
        add_to_temp_string(c2m_ctx,ptVar6->repr);
        add_to_temp_string(c2m_ctx,ptVar15->repr);
        reverse(c2m_ctx->temp_string);
        if (c2m_ctx->temp_string == (VARR_char *)0x0) goto LAB_0019478f;
        set_string_stream(c2m_ctx,c2m_ctx->temp_string->varr,ptVar6->pos,
                          (_func_void_char_ptr_VARR_char_ptr *)0x0);
        ptVar14 = get_next_pptoken_1(c2m_ctx,0);
        do {
          ptVar15 = get_next_pptoken_1(c2m_ctx,0);
        } while (*(short *)ptVar15 == 0x147);
        if (*(short *)ptVar15 != 0x13d) {
          reverse(c2m_ctx->temp_string);
          uVar8._0_4_ = (ptVar6->pos).lno;
          uVar8._4_4_ = (ptVar6->pos).ln_pos;
          error(c2m_ctx,0x1c36c9,(ptVar6->pos).fname,uVar8);
          if (c2m_ctx->cs->f != (FILE *)0x0) goto LAB_00194799;
          pVVar9 = c2m_ctx->streams;
          if (((pVVar9 == (VARR_stream_t *)0x0) || (pVVar9->varr == (stream_t *)0x0)) ||
             (sVar10 = pVVar9->els_num, sVar10 == 0)) goto LAB_0019478a;
          pVVar9->els_num = sVar10 - 1;
          free_stream(pVVar9->varr[sVar10 - 1]);
          pVVar9 = c2m_ctx->streams;
          if (((pVVar9 == (VARR_stream_t *)0x0) || (pVVar9->varr == (stream_t *)0x0)) ||
             (pVVar9->els_num == 0)) goto LAB_00194785;
          c2m_ctx->cs = pVVar9->varr[pVVar9->els_num - 1];
        }
        del_tokens(tokens,iVar13 + 1,uVar20 - iVar13);
        if ((tokens->varr == (token_t *)0x0) || ((VARR_token_t *)tokens->els_num <= unaff_R12))
        goto LAB_00194729;
        tokens->varr[(long)unaff_R12] = ptVar14;
      }
      uVar19 = (uint)tokens->els_num;
      uVar20 = (uint)unaff_R12;
    } while( true );
  }
  do_concat_cold_15();
  c2m_ctx_00 = (c2m_ctx_t)pcVar23->env[0].__jmpbuf[0];
  if (c2m_ctx_00 != (c2m_ctx_t)0x0) {
    pcVar26 = (c2mir_options *)((long)&pcVar23->ctx->gen_ctx + 1);
    if (pcVar23->options < pcVar26) {
      pcVar26 = (c2mir_options *)((long)&pcVar26->message_file + ((ulong)pcVar26 >> 1));
      pvVar17 = realloc(c2m_ctx_00,(long)pcVar26 * 8);
      pcVar23->env[0].__jmpbuf[0] = (long)pvVar17;
      pcVar23->options = pcVar26;
    }
    pMVar11 = pcVar23->ctx;
    pcVar23->ctx = (MIR_context_t)((long)&pMVar11->gen_ctx + 1);
    *(VARR_token_t **)(pcVar23->env[0].__jmpbuf[0] + (long)pMVar11 * 8) = pVVar22;
    return (VARR_token_t *)pMVar11;
  }
  VARR_macro_call_tpush_cold_1();
  *extraout_RDX = 0;
  sVar3 = (short)pVVar22->els_num;
  if ((sVar3 != 0x102) && (sVar3 != 0x13e)) {
    __assert_fail("t->code == T_STR || t->code == T_HEADER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x99b,"const char *get_include_fname(c2m_ctx_t, token_t, const char **)");
  }
  pVVar5 = *(VARR_token_t **)(pVVar22[1].size + 0x20);
  if ((char)pVVar5->els_num != '/') {
    if (*(char *)pVVar22[1].varr == '\"') {
      pcVar18 = c2m_ctx_00->cs->fname;
      if (pcVar18 != (char *)0x0) {
        unaff_R12 = (VARR_token_t *)get_full_name(c2m_ctx_00,pcVar18,(char *)pVVar5,0);
        iVar13 = file_found_p((char *)unaff_R12);
        if (iVar13 != 0) {
          sVar29 = uniq_cstr(c2m_ctx_00,(char *)unaff_R12);
          return (VARR_token_t *)sVar29.s;
        }
      }
      bVar28 = *c2m_ctx_00->header_dirs == (char *)0x0;
      if (!bVar28) {
        unaff_R12 = (VARR_token_t *)
                    get_full_name(c2m_ctx_00,*c2m_ctx_00->header_dirs,(char *)pVVar5,1);
        iVar13 = file_found_p((char *)unaff_R12);
        if (iVar13 == 0) {
          lVar25 = 8;
          do {
            pcVar18 = *(char **)((long)c2m_ctx_00->header_dirs + lVar25);
            bVar28 = pcVar18 == (char *)0x0;
            if (bVar28) goto LAB_0019492f;
            unaff_R12 = (VARR_token_t *)get_full_name(c2m_ctx_00,pcVar18,(char *)pVVar5,1);
            iVar13 = file_found_p((char *)unaff_R12);
            lVar25 = lVar25 + 8;
          } while (iVar13 == 0);
        }
        sVar29 = uniq_cstr(c2m_ctx_00,(char *)unaff_R12);
        unaff_R12 = (VARR_token_t *)sVar29.s;
      }
LAB_0019492f:
      if (!bVar28) {
        return unaff_R12;
      }
    }
    ppcVar21 = &standard_includes[0].content;
    bVar28 = false;
    uVar27 = 0;
    do {
      if ((((string_include_t *)(ppcVar21 + -1))->name != (char *)0x0) &&
         (iVar13 = strcmp((char *)pVVar5,((string_include_t *)(ppcVar21 + -1))->name), iVar13 == 0))
      {
        *extraout_RDX = *ppcVar21;
        unaff_R12 = pVVar5;
        break;
      }
      bVar28 = 9 < uVar27;
      uVar27 = uVar27 + 1;
      ppcVar21 = ppcVar21 + 2;
    } while (uVar27 != 0xb);
    if (!bVar28) {
      return unaff_R12;
    }
    bVar28 = *c2m_ctx_00->system_header_dirs == (char *)0x0;
    if (!bVar28) {
      pcVar18 = get_full_name(c2m_ctx_00,*c2m_ctx_00->system_header_dirs,(char *)pVVar5,1);
      iVar13 = file_found_p(pcVar18);
      if (iVar13 == 0) {
        lVar25 = 8;
        do {
          pcVar18 = *(char **)((long)c2m_ctx_00->system_header_dirs + lVar25);
          bVar28 = pcVar18 == (char *)0x0;
          if (bVar28) goto LAB_00194a0e;
          pcVar18 = get_full_name(c2m_ctx_00,pcVar18,(char *)pVVar5,1);
          iVar13 = file_found_p(pcVar18);
          lVar25 = lVar25 + 8;
        } while (iVar13 == 0);
      }
      sVar29 = uniq_cstr(c2m_ctx_00,pcVar18);
      unaff_R12 = (VARR_token_t *)sVar29.s;
    }
LAB_00194a0e:
    if (!bVar28) {
      return unaff_R12;
    }
  }
  return pVVar5;
}

Assistant:

static VARR (token_t) * do_concat (c2m_ctx_t c2m_ctx, VARR (token_t) * tokens) {
  int i, j, k, empty_j_p, empty_k_p, len = (int) VARR_LENGTH (token_t, tokens);
  token_t t;

  for (i = len - 1; i >= 0; i--)
    if ((t = VARR_GET (token_t, tokens, i))->code == T_RDBLNO) {
      j = i + 1;
      k = i - 1;
      assert (k >= 0 && j < len);
      if (VARR_GET (token_t, tokens, j)->code == ' ' || VARR_GET (token_t, tokens, j)->code == '\n')
        j++;
      if (VARR_GET (token_t, tokens, k)->code == ' ' || VARR_GET (token_t, tokens, k)->code == '\n')
        k--;
      assert (k >= 0 && j < len);
      empty_j_p = VARR_GET (token_t, tokens, j)->code == T_PLM;
      empty_k_p = VARR_GET (token_t, tokens, k)->code == T_PLM;
      if (empty_j_p || empty_k_p) {
        if (!empty_j_p)
          j--;
        else if (j + 1 < len
                 && (VARR_GET (token_t, tokens, j + 1)->code == ' '
                     || VARR_GET (token_t, tokens, j + 1)->code == '\n'))
          j++;
        if (!empty_k_p)
          k++;
        else if (k != 0
                 && (VARR_GET (token_t, tokens, k - 1)->code == ' '
                     || VARR_GET (token_t, tokens, k - 1)->code == '\n'))
          k--;
        if (!empty_j_p || !empty_k_p) {
          del_tokens (tokens, k, j - k + 1);
        } else {
          del_tokens (tokens, k, j - k);
          t = new_token (c2m_ctx, t->pos, "", ' ', N_IGNORE);
          VARR_SET (token_t, tokens, k, t);
        }
      } else {
        t = token_concat (c2m_ctx, VARR_GET (token_t, tokens, k), VARR_GET (token_t, tokens, j));
        del_tokens (tokens, k + 1, j - k);
        VARR_SET (token_t, tokens, k, t);
      }
      i = k;
      len = (int) VARR_LENGTH (token_t, tokens);
    }
  for (i = len - 1; i >= 0; i--) VARR_GET (token_t, tokens, i)->processed_p = TRUE;
  return tokens;
}